

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_visual.cxx
# Opt level: O2

int Fl::visual(int flags)

{
  int iVar1;
  XVisualInfo *pXVar2;
  int i;
  long lVar3;
  XVisualInfo *pXVar4;
  XVisualInfo *v;
  int num;
  XVisualInfo vTemplate;
  
  fl_open_display();
  iVar1 = test_visual(fl_visual,flags);
  if (iVar1 == 0) {
    pXVar2 = (XVisualInfo *)XGetVisualInfo(fl_display,0,&vTemplate,&num);
    pXVar4 = (XVisualInfo *)0x0;
    v = pXVar2;
    for (lVar3 = 0; lVar3 < num; lVar3 = lVar3 + 1) {
      iVar1 = test_visual(v,flags);
      if ((iVar1 != 0) && ((pXVar4 == (XVisualInfo *)0x0 || (pXVar4->depth < v->depth)))) {
        pXVar4 = v;
      }
      v = v + 1;
    }
    if (pXVar4 == (XVisualInfo *)0x0) {
      XFree(pXVar2);
      return 0;
    }
    fl_visual = pXVar4;
    fl_colormap = XCreateColormap(fl_display,
                                  *(undefined8 *)
                                   (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                                  pXVar4->visual,0);
  }
  return 1;
}

Assistant:

int Fl::visual(int flags) {
#if USE_XDBE == 0
  if (flags & FL_DOUBLE) return 0;
#endif
  fl_open_display();
  // always use default if possible:
  if (test_visual(*fl_visual, flags)) return 1;
  // get all the visuals:
  XVisualInfo vTemplate;
  int num;
  XVisualInfo *visualList = XGetVisualInfo(fl_display, 0, &vTemplate, &num);
  // find all matches, use the one with greatest depth:
  XVisualInfo *found = 0;
  for (int i=0; i<num; i++) if (test_visual(visualList[i], flags)) {
    if (!found || found->depth < visualList[i].depth)
      found = &visualList[i];
  }
  if (!found) {XFree((void*)visualList); return 0;}
  fl_visual = found;
  fl_colormap = XCreateColormap(fl_display, RootWindow(fl_display,fl_screen),
				fl_visual->visual, AllocNone);
  return 1;
}